

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

Pattern * __thiscall
trieste::detail::Pattern::operator*(Pattern *__return_storage_ptr__,Pattern *this,Pattern *rhs)

{
  PatternPtr result;
  __shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> local_a0;
  FastPattern local_90;
  
  (*((this->pattern).super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_PatternDef[5])(&local_b0);
  std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,(__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)rhs)
  ;
  PatternDef::set_continuation(local_b0._M_ptr,(PatternPtr *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c0,&local_b0);
  FastPattern::match_seq(&local_90,&this->fast_pattern,&rhs->fast_pattern);
  Pattern(__return_storage_ptr__,(PatternPtr *)&local_c0,&local_90);
  FastPattern::~FastPattern(&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Pattern operator*(Pattern rhs) const
      {
        auto result = pattern->clone();
        result->set_continuation(rhs.pattern);
        return {result, FastPattern::match_seq(fast_pattern, rhs.fast_pattern)};
      }